

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_vmt84.c
# Opt level: O0

void gga_x_vmt84_init(xc_func_type *p)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  gga_x_vmt84_params *params;
  
  pvVar2 = malloc(0x10);
  in_RDI[0x2f] = pvVar2;
  puVar1 = (undefined8 *)in_RDI[0x2f];
  if (*(int *)*in_RDI == 0x44) {
    *puVar1 = 0x3fbf9add3c0ca458;
    puVar1[1] = 0x3ef81e03f705857b;
  }
  else {
    if (*(int *)*in_RDI != 0x45) {
      fprintf(_stderr,"Internal error in gga_x_vmt84\n");
      exit(1);
    }
    *puVar1 = 0x3fcc19110e80c25e;
    puVar1[1] = 0x3f13660e51d25aab;
  }
  return;
}

Assistant:

static void
gga_x_vmt84_init(xc_func_type *p)
{
  gga_x_vmt84_params *params;

  assert(p != NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_x_vmt84_params));
  params = (gga_x_vmt84_params *) (p->params);

  switch(p->info->number){
  case XC_GGA_X_VMT84_PBE:
    params->mu    = 0.2195149727645171;
    params->alpha = 0.000074;
    break;
  case XC_GGA_X_VMT84_GE:
    params->mu = 10.0/81.0;
    params->alpha = 0.000023;
    break;
  default:
    fprintf(stderr, "Internal error in gga_x_vmt84\n");
    exit(1);
  }
}